

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-server.c
# Opt level: O1

size_t ssh1sesschan_write(SshChannel *sc,_Bool is_stderr,void *data,size_t len)

{
  long lVar1;
  undefined7 in_register_00000031;
  
  lVar1 = (*(code *)((sc[0xd].cl)->logctx->queue).tail)
                    ((int)CONCAT71(in_register_00000031,is_stderr) + 0x11);
  BinarySink_put_string((BinarySink *)(lVar1 + 0x60),data,len);
  pq_base_push((PacketQueueBase *)sc[0xe].cl,(PacketQueueNode *)(lVar1 + 0x40));
  return 0;
}

Assistant:

static size_t ssh1sesschan_write(SshChannel *sc, bool is_stderr,
                                 const void *data, size_t len)
{
    struct ssh1_connection_state *s =
        container_of(sc, struct ssh1_connection_state, mainchan_sc);
    PktOut *pktout;

    pktout = ssh_bpp_new_pktout(
        s->ppl.bpp,
        (is_stderr ? SSH1_SMSG_STDERR_DATA : SSH1_SMSG_STDOUT_DATA));
    put_string(pktout, data, len);
    pq_push(s->ppl.out_pq, pktout);

    return 0;
}